

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

uint __thiscall
FMB::FiniteModelMultiSorted::args2var
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *args,DArray<unsigned_int> *sizes,
          DArray<unsigned_int> *offsets,uint s,OperatorType *sig)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  size_t sVar4;
  Term *this_00;
  DArray<unsigned_int> *in_RCX;
  DArray<unsigned_int> *in_RDX;
  DArray<unsigned_int> *in_RSI;
  uint in_R8D;
  uint s_1;
  uint i;
  uint mult;
  uint var;
  TermList in_stack_ffffffffffffffb8;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  puVar2 = Lib::DArray<unsigned_int>::operator[](in_RCX,(ulong)in_R8D);
  local_34 = *puVar2;
  local_38 = 1;
  local_3c = 0;
  while( true ) {
    uVar3 = (ulong)local_3c;
    sVar4 = Lib::DArray<unsigned_int>::size(in_RSI);
    if (sVar4 <= uVar3) break;
    puVar2 = Lib::DArray<unsigned_int>::operator[](in_RSI,(ulong)local_3c);
    local_34 = local_38 * (*puVar2 - 1) + local_34;
    in_stack_ffffffffffffffb8 =
         Kernel::OperatorType::arg(in_stack_ffffffffffffffb8._content,(uint)(uVar3 >> 0x20));
    this_00 = Kernel::TermList::term((TermList *)0x2dac08);
    uVar1 = Kernel::Term::functor(this_00);
    puVar2 = Lib::DArray<unsigned_int>::operator[](in_RDX,(ulong)uVar1);
    local_38 = *puVar2 * local_38;
    local_3c = local_3c + 1;
  }
  return local_34;
}

Assistant:

unsigned args2var(const DArray<unsigned>& args, const DArray<unsigned>& sizes,
                    const DArray<unsigned>& offsets, unsigned s, OperatorType* sig)
  {
    unsigned var = offsets[s];
    unsigned mult = 1;
    for(unsigned i=0;i<args.size();i++){
      var += mult*(args[i]-1);
      unsigned s = sig->arg(i).term()->functor();
      mult *=sizes[s];
    }
    return var;
  }